

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

FString ScriptPresentation(int script)

{
  bool bVar1;
  FString *pFVar2;
  char *tail;
  int in_ESI;
  undefined4 in_register_0000003c;
  FString *this;
  FName local_1c;
  undefined1 local_15;
  FName scrname;
  int script_local;
  FString *out;
  
  this = (FString *)CONCAT44(in_register_0000003c,script);
  local_15 = 0;
  scrname.Index = in_ESI;
  FString::FString(this,"script ");
  if (scrname.Index < 0) {
    FName::FName(&local_1c,-scrname.Index);
    bVar1 = FName::IsValidName(&local_1c);
    if (bVar1) {
      pFVar2 = FString::operator<<(this,'\"');
      tail = FName::GetChars(&local_1c);
      pFVar2 = FString::operator<<(pFVar2,tail);
      FString::operator<<(pFVar2,'\"');
      return (FString)(char *)this;
    }
  }
  FString::AppendFormat(this,"%d",(ulong)(uint)scrname.Index);
  return (FString)(char *)this;
}

Assistant:

static FString ScriptPresentation(int script)
{
	FString out = "script ";

	if (script < 0)
	{
		FName scrname = FName(ENamedName(-script));
		if (scrname.IsValidName())
		{
			out << '"' << scrname.GetChars() << '"';
			return out;
		}
	}
	out.AppendFormat("%d", script);
	return out;
}